

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

int Abc_NtkGetExorNum(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pObj;
  int local_20;
  int local_1c;
  int Counter;
  int i;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_1c < iVar1; local_1c = local_1c + 1) {
    pObj = Abc_NtkObj(pNtk,local_1c);
    if ((pObj != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj), iVar1 != 0)) {
      local_20 = (*(uint *)&pObj->field_0x14 >> 8 & 1) + local_20;
    }
  }
  return local_20;
}

Assistant:

int Abc_NtkGetExorNum( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i, Counter = 0;
    Abc_NtkForEachNode( pNtk, pNode, i )
        Counter += pNode->fExor;
    return Counter;
}